

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.cpp
# Opt level: O0

void __thiscall CVmDbgFrameSymPtr::get_str_val(CVmDbgFrameSymPtr *this,vm_val_t *val)

{
  int iVar1;
  vm_obj_id_t obj;
  void *p;
  char *str;
  unsigned_long uVar2;
  vm_val_t *in_RSI;
  long *in_RDI;
  char *symp;
  size_t in_stack_ffffffffffffffd0;
  
  p = (void *)(*in_RDI + G_dbg_lclsym_hdr_size_X);
  iVar1 = is_sym_inline((CVmDbgFrameSymPtr *)0x35496a);
  if (iVar1 == 0) {
    uVar2 = ::osrp4(p);
    vm_val_t::set_sstring(in_RSI,(pool_ofs_t)uVar2);
  }
  else {
    str = (char *)((long)p + 2);
    ::osrp2(p);
    obj = CVmObjString::create((int)((ulong)in_RSI >> 0x20),str,in_stack_ffffffffffffffd0);
    vm_val_t::set_obj(in_RSI,obj);
  }
  return;
}

Assistant:

void CVmDbgFrameSymPtr::get_str_val(VMG_ vm_val_t *val) const
{
    /* get a pointer to the symbol field in this record */
    const char *symp = (const char *)p_ + G_dbg_lclsym_hdr_size;

    /* check whether the symbol string is in-line or in the constant pool */
    if (is_sym_inline())
    {
        /* it's inline, so we need to create a string object for it */
        val->set_obj(CVmObjString::create(vmg_ FALSE, symp + 2, osrp2(symp)));
    }
    else
    {
        /* it's in the constant pool, so we can just return a VM_SSTR */
        val->set_sstring(osrp4(symp));
    }
}